

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

undefined8 cfgfile::format_t<int,cfgfile::string_trait_t>::to_string_abi_cxx11_(int *value)

{
  undefined8 in_RDI;
  int in_stack_0000003c;
  
  std::__cxx11::to_string(in_stack_0000003c);
  return in_RDI;
}

Assistant:

static string_trait_t::string_t to_string( const int & value )
	{
		return std::to_string( value );
	}